

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

QAM * __thiscall QAM::notag(QAM *this)

{
  QAM *in_RDI;
  QAM *q;
  QAM *pQVar1;
  
  pQVar1 = in_RDI;
  QAM(in_RDI,in_RDI);
  std::__cxx11::string::operator=((string *)&pQVar1->tag,"");
  return in_RDI;
}

Assistant:

QAM notag(void) const
    {
        QAM q(*this);
        q.tag = "";
        return q;
    }